

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

gs_val_t *
golf_script_eval_fn(gs_val_t *__return_storage_ptr__,golf_script_t *script,char *name,gs_val_t *args
                   ,int num_args)

{
  vec_gs_env_t *data;
  int *length;
  gs_env_t **ppgVar1;
  undefined8 uVar2;
  map_node_t **ppmVar3;
  _Bool _Var4;
  int iVar5;
  map_base_t *m;
  undefined8 *puVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  gs_val_t fn_val;
  
  m = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
  m->buckets = (map_node_t **)0x0;
  m->nbuckets = 0;
  m->nnodes = 0;
  m[1].buckets = (map_node_t **)0x0;
  m[1].nbuckets = 0;
  m[1].nnodes = 0;
  m[2].buckets = (map_node_t **)0x0;
  m[2].nbuckets = 0;
  m[2].nnodes = 0;
  m[3].buckets = (map_node_t **)"script/eval";
  data = &(script->eval).env;
  length = &(script->eval).env.length;
  iVar5 = vec_expand_((char **)data,length,&(script->eval).env.capacity,8,
                      (script->eval).env.alloc_category);
  if (iVar5 == 0) {
    ppgVar1 = data->data;
    iVar5 = *length;
    *length = iVar5 + 1;
    ppgVar1[iVar5] = (gs_env_t *)m;
  }
  _Var4 = golf_script_get_val(script,name,&fn_val);
  if ((_Var4) && (fn_val.type == GS_VAL_FN)) {
    if (((fn_val.field_2.fn_stmt)->field_1).fn_decl.num_args == num_args) {
      uVar10 = 0;
      uVar7 = (ulong)(uint)num_args;
      if (num_args < 1) {
        uVar7 = uVar10;
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        if ((&(((fn_val.field_2.fn_stmt)->field_1).for_stmt.cond)->type)[uVar9] !=
            *(gs_expr_type *)((long)&args->type + uVar10)) {
          gs_val_error(__return_storage_ptr__,"Invalid arg type");
          goto LAB_00133d19;
        }
        puVar6 = (undefined8 *)((long)&args->type + uVar10);
        pcVar8 = *(char **)((long)&((((fn_val.field_2.fn_stmt)->field_1).for_stmt.inc)->token).col +
                           uVar10);
        uVar2 = puVar6[2];
        m[2].nbuckets = (int)uVar2;
        m[2].nnodes = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *puVar6;
        ppmVar3 = (map_node_t **)puVar6[1];
        m[1].nbuckets = (int)uVar2;
        m[1].nnodes = (int)((ulong)uVar2 >> 0x20);
        m[2].buckets = ppmVar3;
        map_set_(m,pcVar8,&m[1].nbuckets,0x18,(char *)m[3].buckets);
        uVar10 = uVar10 + 0x18;
      }
      gs_eval_stmt(__return_storage_ptr__,&script->eval,
                   ((fn_val.field_2.fn_stmt)->field_1).for_stmt.body);
      goto LAB_00133d19;
    }
    pcVar8 = "Invalid number of args";
  }
  else {
    pcVar8 = "Could not find function";
  }
  gs_val_error(__return_storage_ptr__,pcVar8);
LAB_00133d19:
  *length = *length + -1;
  map_deinit_(m);
  golf_free_tracked(m);
  return __return_storage_ptr__;
}

Assistant:

gs_val_t golf_script_eval_fn(golf_script_t *script, const char *name, gs_val_t *args, int num_args) {
    gs_val_t val;
    gs_env_t *env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&env->val_map, "script/eval");
    vec_push(&script->eval.env, env);

    gs_val_t fn_val;
    if (!golf_script_get_val(script, name, &fn_val) || fn_val.type != GS_VAL_FN) {
        val = gs_val_error("Could not find function");
        goto cleanup;
    }

    gs_stmt_t *fn_stmt = (gs_stmt_t*) fn_val.fn_stmt;
    if (num_args != fn_stmt->fn_decl.num_args) {
        val = gs_val_error("Invalid number of args");
        goto cleanup;
    }

    for (int i = 0; i < num_args; i++) {
        const char *symbol = fn_stmt->fn_decl.arg_symbols[i].symbol;
        gs_val_type type = fn_stmt->fn_decl.arg_types[i];
        if (type != args[i].type) {
            val = gs_val_error("Invalid arg type");
            goto cleanup;
        }
        map_set(&env->val_map, symbol, args[i]);
    }

    val = gs_eval_stmt(&script->eval, fn_stmt->fn_decl.body);

cleanup:
    (void)vec_pop(&script->eval.env);
    map_deinit(&env->val_map);
    golf_free(env);
    return val;
}